

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O2

int shm::open(char *__file,int __oflag,...)

{
  int __fd;
  int iVar1;
  void *pvVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  TemplateSHMException<0> *pTVar6;
  shm_key_t *key;
  string sStack_258;
  stringstream ss;
  ostream local_228 [376];
  stat st;
  
  key = (shm_key_t *)0x42;
  __fd = shm_open(__file,0x42,0);
  if (__fd == -1) {
    open::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)__file,key);
  }
  else {
    memset(&st,0,0x90);
    iVar1 = fstat(__fd,(stat *)&st);
    if (iVar1 == 0) {
      pvVar2 = mmap((void *)0x0,st.st_size,3,1,__fd,0);
      if (pvVar2 != (void *)0xffffffffffffffff) {
        ::close(__fd);
        return (int)pvVar2;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_228,"Failed to mmap shm region with the following error: ");
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::operator<<(poVar3,",\n");
      std::operator<<(local_228,"unlinking.");
      shm_unlink(__file);
      pTVar6 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      TemplateSHMException<0>::TemplateSHMException(pTVar6,&sStack_258);
      __cxa_throw(pTVar6,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_228,"Failed to stat shm region with the following error: ");
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::operator<<(poVar3,",\n");
  std::operator<<(local_228,"unlinking.");
  shm_unlink(__file);
  pTVar6 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  TemplateSHMException<0>::TemplateSHMException(pTVar6,&sStack_258);
  __cxa_throw(pTVar6,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
}

Assistant:

void*
shm::open( const shm_key_t &key )
{
   /**
    * just like with init, use same output
    * pointer stack location for both. 
    */
   void *out( nullptr );
    
    auto handle_open_failure = [&]( const shm_key_t &key ) -> void*
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
        ss << 
            "Failed to open shm with key \"" << key << "\", with the following error code (";
        ss << std::strerror( errno ) << ")"; 
        throw bad_shm_alloc( ss.str() );
#else
        return( nullptr );
#endif

    };
#if _USE_POSIX_SHM_ == 1
   int fd( shm::failure );
   const int flags( O_RDWR | O_CREAT );
   mode_t mode( 0 );
   fd = shm_open( key, 
                  flags, 
                  mode ); 
   if( fd == failure )
   {
        return( handle_open_failure( key ) );
   }
   struct stat st;
   std::memset( &st, 
                0x0, 
                sizeof( struct stat ) );
   /* stat the file to get the size */
   if( fstat( fd, &st ) != shm::success )
   {
#if USE_CPP_EXCEPTIONS==1      
      std::stringstream ss;
      ss << "Failed to stat shm region with the following error: " << std::strerror( errno ) << ",\n";
      ss << "unlinking.";
      shm_unlink( key );
      throw bad_shm_alloc( ss.str() );
#else
      shm_unlink( key );
      return( nullptr );
#endif
   }
   out = mmap( nullptr, 
               st.st_size, 
               (PROT_READ | PROT_WRITE), 
               MAP_SHARED, 
               fd, 
               0 );
   if( out == MAP_FAILED )
   {
#if USE_CPP_EXCEPTIONS==1      
      std::stringstream ss;
      ss << "Failed to mmap shm region with the following error: " << std::strerror( errno ) << ",\n";
      ss << "unlinking.";
      shm_unlink( key );
      throw bad_shm_alloc( ss.str() );
#else
      shm_unlink( key );
      return( nullptr );
#endif
   }
   /* close fd */
   ::close( fd );
   /* done, return mem */
   return( out );

/** END POSIX MEMORY **/
#elif _USE_SYSTEMV_SHM_ == 1
/** START SYSTEMV MEMORY **/

//STEP1 shmget
    const auto shmid = 
        shmget( key, sizeof(int), S_IRUSR | S_IWUSR );
    if( shmid == shm::failure ) 
    {
        //if using exceptions, you won't return from this
        return( handle_open_failure( key ) );
    }
//STEP2 shmat
    out = shmat(shmid, nullptr, 0);
    if( out == (void*)-1 ) 
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
        ss << "Failed to SHM attach the shm region with the following error (" 
            <<  std::strerror( errno ) << ").";
        throw bad_shm_alloc( ss.str() );
#else
        return( nullptr );
#endif
    }
/** END SYSTEMV MEMORY **/
#endif
    //if we're here, everything theoretically worked
    return( out );
}